

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamReaderPrivate::GetNextAlignment
          (BamReaderPrivate *this,BamAlignment *alignment)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  BamAlignment *in_stack_00000010;
  BamReaderPrivate *in_stack_00000018;
  string message;
  string alError;
  BamAlignment *in_stack_00000198;
  BamAlignment *in_stack_ffffffffffffff28;
  allocator local_b1;
  string local_b0 [55];
  allocator local_79;
  string local_78 [8];
  string *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  byte local_1;
  
  local_18 = in_RSI;
  bVar1 = GetNextAlignmentCore(in_stack_00000018,in_stack_00000010);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)(local_18 + 0xe0),(string *)(in_RDI + 8));
    bVar1 = BamAlignment::BuildCharData(in_stack_00000198);
    if (bVar1) {
      local_1 = 1;
    }
    else {
      BamAlignment::GetErrorString_abi_cxx11_(in_stack_ffffffffffffff28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"could not populate alignment data: \n\t",&local_79);
      std::operator+(&local_58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     &local_38);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"BamReader::GetNextAlignment",&local_b1);
      SetErrorString((BamReaderPrivate *)in_stack_ffffffffffffffa0,
                     (string *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      local_1 = 0;
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamReaderPrivate::GetNextAlignment(BamAlignment& alignment)
{

    // if valid alignment found
    if (GetNextAlignmentCore(alignment)) {

        // store alignment's "source" filename
        alignment.Filename = m_filename;

        // return success/failure of parsing char data
        if (alignment.BuildCharData())
            return true;
        else {
            const std::string alError = alignment.GetErrorString();
            const std::string message =
                std::string("could not populate alignment data: \n\t") + alError;
            SetErrorString("BamReader::GetNextAlignment", message);
            return false;
        }
    }

    // no valid alignment found
    return false;
}